

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTestResult.cpp
# Opt level: O1

void __thiscall
UnitTest::DeferredTestResult::DeferredTestResult(DeferredTestResult *this,char *suite,char *test)

{
  allocator<char> local_12;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,suite,&local_11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->testName,test,&local_12);
  (this->failureFile)._M_dataplus._M_p = (pointer)&(this->failureFile).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->failureFile,"");
  *(undefined8 *)
   ((long)&(this->failures).
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->failures).
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (this->failures).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->failures).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

DeferredTestResult::DeferredTestResult(char const* suite, char const* test)
	: suiteName(suite)
	, testName(test)
	, failureFile("")
	, timeElapsed(0.0f)
	, failed(false)
{
}